

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::array_n
          (array_n<float,_3,_std::allocator<float>_> *this,uint d0,...)

{
  uint uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar2;
  undefined8 in_R8;
  uint *puVar3;
  ulong uVar4;
  uint *puVar5;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_b8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  puVar3 = (uint *)&stack0x00000008;
  this->_dims[0] = d0;
  vl[0].gp_offset = 0x10;
  for (lVar2 = 3; lVar2 != 5; lVar2 = lVar2 + 1) {
    if (vl[0].gp_offset < 0x29) {
      uVar4 = (ulong)vl[0].gp_offset;
      vl[0].gp_offset = vl[0].gp_offset + 8;
      puVar5 = (uint *)((long)local_b8 + uVar4);
    }
    else {
      puVar5 = puVar3;
      puVar3 = puVar3 + 2;
    }
    uVar1 = *puVar5;
    this->_dims[lVar2 + -2] = uVar1;
    d0 = d0 * uVar1;
  }
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  _alloc(this,d0);
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }